

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader14.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::NodeLoader14::begin__instance_material(NodeLoader14 *this)

{
  instance_material__AttributeData *in_stack_00000128;
  NodeLoader14 *in_stack_00000130;
  
  begin__instance_material(in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

bool NodeLoader14::begin__instance_material( const COLLADASaxFWL14::instance_material__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__instance_material(attributeData));
COLLADASaxFWL::instance_material__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.symbol = attributeData.symbol;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL14::instance_material__AttributeData::ATTRIBUTE_TARGET_PRESENT) == COLLADASaxFWL14::instance_material__AttributeData::ATTRIBUTE_TARGET_PRESENT ) {
    attrData.target = attributeData.target;
    attrData.present_attributes |= COLLADASaxFWL::instance_material__AttributeData::ATTRIBUTE_TARGET_PRESENT;
}
return mLoader->begin__instance_material(attrData);
}